

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

void __thiscall
wallet::SelectionResult::RecalculateWaste
          (SelectionResult *this,CAmount min_viable_change,CAmount change_cost,CAmount change_fee)

{
  long lVar1;
  COutput *this_00;
  long lVar2;
  CAmount CVar3;
  _Base_ptr p_Var4;
  long lVar5;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *__range1;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    __assert_fail("!m_selected_inputs.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                  ,0x33f,
                  "void wallet::SelectionResult::RecalculateWaste(const CAmount, const CAmount, const CAmount)"
                 );
  }
  lVar6 = 0;
  for (p_Var4 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    this_00 = *(COutput **)(p_Var4 + 1);
    CVar3 = COutput::GetFee(this_00);
    lVar6 = (CVar3 + lVar6) - this_00->long_term_fee;
  }
  lVar2 = this->bump_fee_group_discount;
  CVar3 = GetChange(this,min_viable_change,change_fee);
  if (CVar3 == 0) {
    if (this->m_use_effective == true) {
      lVar5 = GetSelectedEffectiveValue(this);
    }
    else {
      lVar5 = GetSelectedValue(this);
    }
    change_cost = lVar5 - this->m_target;
    if (lVar5 < this->m_target) {
      __assert_fail("selected_effective_value >= m_target",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                    ,0x351,
                    "void wallet::SelectionResult::RecalculateWaste(const CAmount, const CAmount, const CAmount)"
                   );
    }
  }
  (this->m_waste).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = (lVar6 - lVar2) + change_cost;
  (this->m_waste).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectionResult::RecalculateWaste(const CAmount min_viable_change, const CAmount change_cost, const CAmount change_fee)
{
    // This function should not be called with empty inputs as that would mean the selection failed
    assert(!m_selected_inputs.empty());

    // Always consider the cost of spending an input now vs in the future.
    CAmount waste = 0;
    for (const auto& coin_ptr : m_selected_inputs) {
        const COutput& coin = *coin_ptr;
        waste += coin.GetFee() - coin.long_term_fee;
    }
    // Bump fee of whole selection may diverge from sum of individual bump fees
    waste -= bump_fee_group_discount;

    if (GetChange(min_viable_change, change_fee)) {
        // if we have a minimum viable amount after deducting fees, account for
        // cost of creating and spending change
        waste += change_cost;
    } else {
        // When we are not making change (GetChange(…) == 0), consider the excess we are throwing away to fees
        CAmount selected_effective_value = m_use_effective ? GetSelectedEffectiveValue() : GetSelectedValue();
        assert(selected_effective_value >= m_target);
        waste += selected_effective_value - m_target;
    }

    m_waste = waste;
}